

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::AutoCloseFd> * __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdirInternal
          (Maybe<kj::AutoCloseFd> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  PathPtr path_00;
  bool bVar1;
  int iVar2;
  int code;
  char *__file;
  AutoCloseFd result;
  undefined1 local_58 [4];
  UnwindDetector UStack_54;
  size_t local_50;
  PathPtr local_40;
  
  local_40.parts.size_ = path.parts.size_;
  local_40.parts.ptr = path.parts.ptr;
  do {
    iVar2 = (this->fd).fd;
    PathPtr::toString((String *)local_58,&local_40,false);
    __file = "";
    if (local_50 != 0) {
      __file = (char *)CONCAT44(UStack_54.uncaughtCount,local_58);
    }
    iVar2 = openat(iVar2,__file,0x90000);
    Array<char>::~Array((Array<char> *)local_58);
    if (-1 < iVar2) goto LAB_0031ab90;
    code = _::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code == 0) {
LAB_0031ab90:
    local_58 = (undefined1  [4])iVar2;
    UnwindDetector::UnwindDetector(&UStack_54);
    _::NullableValue<kj::AutoCloseFd>::NullableValue
              (&__return_storage_ptr__->ptr,(AutoCloseFd *)local_58);
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_58);
    return __return_storage_ptr__;
  }
  if (code == 0x14) {
    path_00.parts.size_ = local_40.parts.size_;
    path_00.parts.ptr = local_40.parts.ptr;
    bVar1 = exists(this,path_00);
    if (bVar1) goto LAB_0031abd2;
  }
  else if (code != 2) {
LAB_0031abd2:
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x303,code,"openat(fd, path, O_DIRECTORY)","path",&local_40);
    (__return_storage_ptr__->ptr).isSet = false;
    _::Debug::Fault::~Fault((Fault *)local_58);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

Maybe<AutoCloseFd> tryOpenSubdirInternal(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY)) {
      case ENOENT:
        return nullptr;
      case ENOTDIR:
        // Could mean that a parent is not a directory, which we treat as "doesn't exist".
        // Could also mean that the specified file is not a directory, which should throw.
        // Check using exists().
        if (!exists(path)) {
          return nullptr;
        }
        // fallthrough
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_DIRECTORY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }